

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void rollback_ncommits(void)

{
  fdb_status fVar1;
  fdb_status status;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_kvs_info info;
  fdb_kvs_handle *kv2;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  char keybuf [256];
  int ncommits;
  int n;
  int j;
  int i;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  void *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  void *in_stack_fffffffffffffd50;
  fdb_kvs_handle *in_stack_fffffffffffffd58;
  fdb_seqnum_t in_stack_fffffffffffffe40;
  fdb_kvs_handle **in_stack_fffffffffffffe48;
  long local_1a8;
  long local_1a0;
  fdb_kvs_info *in_stack_fffffffffffffe80;
  fdb_kvs_handle *in_stack_fffffffffffffe88;
  char local_168 [40];
  fdb_kvs_config *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  fdb_kvs_handle **in_stack_fffffffffffffed0;
  fdb_file_handle *in_stack_fffffffffffffed8;
  fdb_config *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  fdb_file_handle **in_stack_ffffffffffffff48;
  uint local_5c;
  uint local_58;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  fdb_kvs_open(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0);
  fdb_kvs_open(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0);
  local_5c = 0;
  do {
    if (9 < (int)local_5c) {
      local_5c = 10;
      do {
        if ((int)local_5c < 1) {
          fdb_kvs_close(in_stack_fffffffffffffd18);
          fdb_close((fdb_file_handle *)in_stack_fffffffffffffd18);
          fdb_shutdown();
          memleak_end();
          if (rollback_ncommits::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","rollback n commits");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","rollback n commits");
          }
          return;
        }
        fVar1 = fdb_rollback(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xbc3);
          rollback_ncommits::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xbc3,"void rollback_ncommits()");
          }
        }
        fdb_get_kvs_info(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        if (local_1a0 != local_1a8) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xbc7);
          rollback_ncommits::__test_pass = 0;
          if (local_1a0 != local_1a8) {
            __assert_fail("info.doc_count == info.last_seqnum",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xbc7,"void rollback_ncommits()");
          }
        }
        local_5c = local_5c + -1;
      } while( true );
    }
    for (local_58 = 0; (int)local_58 < 100; local_58 = local_58 + 1) {
      in_stack_fffffffffffffd18 = in_stack_fffffffffffffe88;
      sprintf(local_168,"key%02d%03d",(ulong)local_5c,(ulong)local_58);
      in_stack_fffffffffffffe88 = in_stack_fffffffffffffd18;
      strlen(local_168);
      fdb_set_kv(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 in_stack_fffffffffffffd40,
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      strlen(local_168);
      fdb_set_kv(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 in_stack_fffffffffffffd40,
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    if ((int)local_5c % 2 == 0) {
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffffd18,'\0');
    }
    else {
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffffd18,'\0');
    }
    fdb_get_kvs_info(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    if (local_1a0 != local_1a8) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xbbd);
      rollback_ncommits::__test_pass = 0;
      if (local_1a0 != local_1a8) {
        __assert_fail("info.doc_count == info.last_seqnum",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xbbd,"void rollback_ncommits()");
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

void rollback_ncommits()
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, j, n=100;
    int ncommits=10;
    char keybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_status status;
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &kv2, NULL, &kvs_config);


    for(j=0;j<ncommits;++j){

        // set n docs per commit
        for(i=0;i<n;++i){
            sprintf(keybuf, "key%02d%03d", j, i);
            fdb_set_kv(kv1, keybuf, strlen(keybuf), NULL, 0);
            fdb_set_kv(kv2, keybuf, strlen(keybuf), NULL, 0);
        }
        // alternate commit pattern
        if((j % 2) == 0){
            fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        } else {
            fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        }

        // doc_count should match seqnum since they are unique
        fdb_get_kvs_info(kv1, &info);
        TEST_CHK(info.doc_count == info.last_seqnum);
    }

    // iteratively rollback 5 commits
     for(j=ncommits;j>0;--j){
        status = fdb_rollback(&kv1, j*n);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // check rollback doc_count
        fdb_get_kvs_info(kv1, &info);
        TEST_CHK(info.doc_count == info.last_seqnum);
    }

    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    TEST_RESULT("rollback n commits");
}